

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pvip_string.c
# Opt level: O1

char * PVIP_string_c_str(PVIPString *str)

{
  char *pcVar1;
  size_t __size;
  
  if (str->buflen == str->len) {
    __size = str->buflen + 1;
    str->buflen = __size;
    pcVar1 = (char *)realloc(str->buf,__size);
    str->buf = pcVar1;
    if (pcVar1 == (char *)0x0) {
      return (char *)0x0;
    }
  }
  str->buf[str->len] = '\0';
  return str->buf;
}

Assistant:

const char *PVIP_string_c_str(PVIPString *str) {
    if (str->buflen == str->len) {
        str->buflen++;
        str->buf    = realloc(str->buf, str->buflen);
        if (!str->buf) {
            return NULL;
        }
    }
    str->buf[str->len+1-1] = '\0';
    return str->buf;
}